

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebox.c
# Opt level: O3

int output_cvs(char *fname,int length)

{
  int iVar1;
  FILE *__stream;
  ulong uVar2;
  long lVar3;
  
  __stream = fopen(fname,"w");
  if (__stream == (FILE *)0x0) {
    iVar1 = 0;
  }
  else {
    if (0 < length) {
      lVar3 = 0;
      uVar2 = 0;
      do {
        fprintf(__stream,"%d %d %d\n",uVar2,(ulong)(uint)(int)*(short *)((long)stream1 + lVar3),
                (ulong)(uint)(int)*(short *)((long)stream2 + lVar3));
        uVar2 = (ulong)((int)uVar2 + 1);
        lVar3 = lVar3 + 2;
      } while ((ulong)(uint)length * 2 != lVar3);
    }
    fclose(__stream);
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int output_cvs(char *fname, int length)
{
   FILE *fp;
 
   int  i;

   fp = fopen(fname, "w");
   if(fp == NULL) 
      return 0;
   for (i = 0; i < length; i++)
   {
      fprintf(fp, "%d %d %d\n", i, stream1[i], stream2[i]);
   }
   fclose(fp);
   
   return 1;
}